

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesOptionsWidget.cxx
# Opt level: O2

void __thiscall cmCursesOptionsWidget::SetOption(cmCursesOptionsWidget *this,string *value)

{
  __type _Var1;
  size_type sVar2;
  pointer __lhs;
  
  this->CurrentOption = 0;
  (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])();
  sVar2 = 0;
  for (__lhs = (this->Options).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __lhs != (this->Options).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
    _Var1 = std::operator==(__lhs,value);
    if (_Var1) {
      this->CurrentOption = sVar2;
    }
    sVar2 = sVar2 + 1;
  }
  return;
}

Assistant:

void cmCursesOptionsWidget::SetOption(const std::string& value)
{
  this->CurrentOption = 0; // default to 0 index
  this->SetValue(value);
  int index = 0;
  for(std::vector<std::string>::iterator i = this->Options.begin();
      i != this->Options.end(); ++i)
    {
    if(*i == value)
      {
      this->CurrentOption = index;
      }
    index++;
    }
}